

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

iterator __thiscall
QHash<QWidget*,QRect>::emplace<QRect_const&>(QHash<QWidget*,QRect> *this,QWidget **key,QRect *args)

{
  Data<QHashPrivate::Node<QWidget_*,_QRect>_> *pDVar1;
  long in_FS_OFFSET;
  piter pVar2;
  QRect local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data<QHashPrivate::Node<QWidget_*,_QRect>_> **)this;
  if (pDVar1 == (Data<QHashPrivate::Node<QWidget_*,_QRect>_> *)0x0) {
    local_38._0_8_ = (Data<QHashPrivate::Node<QWidget_*,_QRect>_> *)0x0;
LAB_006191e3:
    pDVar1 = (Data<QHashPrivate::Node<QWidget_*,_QRect>_> *)0x0;
LAB_00619204:
    pDVar1 = QHashPrivate::Data<QHashPrivate::Node<QWidget_*,_QRect>_>::detached(pDVar1);
    *(Data<QHashPrivate::Node<QWidget_*,_QRect>_> **)this = pDVar1;
  }
  else {
    if ((uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i < 2) {
      if (pDVar1->size < pDVar1->numBuckets >> 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar2 = (piter)emplace_helper<QRect_const&>(this,key,args);
          return (iterator)pVar2;
        }
      }
      else {
        local_38._0_8_ = *(undefined8 *)args;
        local_38.x2.m_i = (args->x2).m_i;
        local_38.y2.m_i = (args->y2).m_i;
        pVar2 = (piter)QHash<QWidget_*,_QRect>::emplace_helper<QRect>
                                 ((QHash<QWidget_*,_QRect> *)this,key,&local_38);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar2;
        }
      }
      goto LAB_0061926d;
    }
    local_38._0_8_ = pDVar1;
    if ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
      LOCK();
      (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pDVar1 = *(Data<QHashPrivate::Node<QWidget_*,_QRect>_> **)this;
      if (pDVar1 == (Data<QHashPrivate::Node<QWidget_*,_QRect>_> *)0x0) goto LAB_006191e3;
    }
    if (1 < (uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i) goto LAB_00619204;
  }
  pVar2 = (piter)emplace_helper<QRect_const&>(this,key,args);
  QHash<QWidget_*,_QRect>::~QHash((QHash<QWidget_*,_QRect> *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar2;
  }
LAB_0061926d:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }